

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clnt_bcast.c
# Opt level: O3

clnt_stat rpc_broadcast_exp(rpcprog_t prog,rpcvers_t vers,rpcproc_t proc,xdrproc_t xargs,void *argsp
                           ,xdrproc_t xresults,void *resultsp,resultproc_t eachresult,int inittime,
                           int waittime,char *nettype)

{
  int iVar1;
  int iVar2;
  void *pvVar3;
  void *pvVar4;
  bool bVar5;
  broadif *list;
  _Bool _Var6;
  int iVar7;
  u_int uVar8;
  uint uVar9;
  bool_t bVar10;
  uint uVar11;
  AUTH *pAVar12;
  void *vhandle;
  netconfig *nconf;
  int *piVar13;
  int *addr;
  int *addr_00;
  ulong uVar14;
  int *piVar15;
  netbuf *pnVar16;
  int iVar17;
  nfds_t nVar18;
  caddr_t *ppcVar19;
  clnt_stat cVar20;
  char *pcVar21;
  ulong uVar22;
  code *pcVar23;
  nfds_t __nfds;
  long lVar24;
  ulong uVar25;
  netbuf taddr;
  rmtcallargs barg_pmap;
  rmtcallres bres_pmap;
  r_rpcb_rmtcallargs barg;
  XDR xdrs [1];
  r_rpcb_rmtcallres bres;
  timespec ts;
  pollfd pfd [20];
  rpc_msg msg;
  anon_struct_176_8_b9f7f77a fdlist [20];
  char uaddress [1024];
  clnt_stat local_1ad0;
  uint local_1acc;
  int local_1a90;
  undefined8 local_1a60;
  sockaddr *local_1a58;
  void *local_1a50;
  rmtcallargs local_1a48;
  ushort local_1a14;
  rpcb_rmtcallargs local_1a10;
  xdrproc_t local_19f0;
  XDR local_19e8;
  char *local_1978 [2];
  void *local_1968;
  xdrproc_t local_1960;
  timespec local_1958;
  pollfd local_1948 [21];
  undefined1 local_18a0 [48];
  undefined1 local_1870 [428];
  undefined8 local_16c4;
  rpcproc_t local_16bc;
  undefined1 local_16b8 [408];
  undefined1 local_1520 [808];
  int local_11f8;
  undefined8 local_11f4;
  undefined8 local_11e8;
  u_int local_11e0 [2];
  sockaddr asStack_11d8 [8];
  broadif *local_1158 [2];
  broadif local_1148 [22];
  char local_438 [1032];
  
  pAVar12 = authunix_ncreate_default();
  cVar20 = (pAVar12->ah_error).re_status;
  if (cVar20 != RPC_SUCCESS) {
    LOCK();
    piVar13 = &pAVar12->ah_refcnt;
    iVar7 = *piVar13;
    *piVar13 = *piVar13 + -1;
    UNLOCK();
    if (iVar7 - 1U == 0) {
      (*pAVar12->ah_ops->ah_destroy)(pAVar12);
    }
    if (((byte)__ntirpc_pkg_params.debug_flags & 0x80) == 0) {
      return cVar20;
    }
    (*__ntirpc_pkg_params.warnx_)
              ("%s: auth_put(), refs %d\n","rpc_broadcast_exp",(ulong)(iVar7 - 1U));
    return cVar20;
  }
  pcVar21 = "datagram_n";
  if (nettype != (char *)0x0) {
    pcVar21 = nettype;
  }
  vhandle = __rpc_setconf(pcVar21);
  if (vhandle == (void *)0x0) {
    local_1ad0 = RPC_UNKNOWNPROTO;
    goto LAB_0010adc2;
  }
  nconf = __rpc_getconf(vhandle);
  if (nconf != (netconfig *)0x0) {
    local_1a90 = inittime;
    __nfds = 0;
    local_1ad0 = RPC_SUCCESS;
    uVar11 = 0;
    local_1acc = 0;
    bVar5 = false;
    do {
      if (nconf->nc_semantics == 1) {
        if (0x13 < __nfds) goto LAB_0010a95c;
        iVar7 = __rpc_nconf2sockinfo(nconf,(__rpc_sockinfo *)local_18a0);
        if (iVar7 != 0) {
          list = (broadif *)((broadlist_t *)local_1148 + __nfds * 0xb + -1);
          *(broadif **)&list->index = (broadif *)0x0;
          local_1158[__nfds * 0x16 + 1] = list;
          iVar7 = __rpc_getbroadifs(local_18a0._0_4_,local_18a0._4_4_,local_18a0._8_4_,
                                    (broadlist_t *)list);
          if (iVar7 != 0) {
            iVar7 = socket(local_18a0._0_4_,local_18a0._8_4_,local_18a0._4_4_);
            if (iVar7 < 0) {
              local_1ad0 = RPC_CANTSEND;
            }
            else {
              (&local_11f4)[__nfds * 0x16] = CONCAT44(local_18a0._4_4_,local_18a0._0_4_);
              (&local_11f8)[__nfds * 0x2c] = iVar7;
              (&local_11e8)[__nfds * 0x16] = nconf;
              uVar8 = __rpc_get_a_size(local_18a0._0_4_);
              local_11e0[__nfds * 0x2c] = uVar8;
              local_1948[__nfds].events = 0xc3;
              (&local_11f8)[__nfds * 0x2c] = iVar7;
              local_1948[__nfds].fd = iVar7;
              uVar8 = __rpc_get_t_size(local_18a0._0_4_,local_18a0._4_4_,0);
              *(u_int *)(asStack_11d8[__nfds * 0xb + -1].sa_data + 10) = uVar8;
              if (uVar11 <= uVar8) {
                uVar11 = uVar8;
              }
              if (uVar8 < local_1acc) {
                uVar8 = local_1acc;
              }
              if (local_18a0._4_4_ == 0x11 && local_18a0._0_4_ == 2) {
                bVar5 = true;
                local_1acc = uVar8;
              }
              __nfds = __nfds + 1;
            }
          }
        }
      }
      nconf = __rpc_getconf(vhandle);
    } while (nconf != (netconfig *)0x0);
    if (__nfds != 0) {
LAB_0010a95c:
      if (uVar11 == 0) {
        if (local_1ad0 == RPC_SUCCESS) {
          local_1ad0 = RPC_CANTSEND;
        }
      }
      else {
        uVar25 = (ulong)uVar11;
        piVar13 = (int *)(*__ntirpc_pkg_params.malloc_)
                                   (uVar25,
                                    "/workspace/llm4binary/github/license_c_cmakelists/linuxbox2[P]ntirpc/src/clnt_bcast.c"
                                    ,0x162,"rpc_broadcast_exp");
        addr = (int *)(*__ntirpc_pkg_params.malloc_)
                                (uVar25,
                                 "/workspace/llm4binary/github/license_c_cmakelists/linuxbox2[P]ntirpc/src/clnt_bcast.c"
                                 ,0x163,"rpc_broadcast_exp");
        local_1a50 = vhandle;
        if (addr == (int *)0x0 || piVar13 == (int *)0x0) {
          local_1ad0 = RPC_SYSTEMERROR;
          addr_00 = (int *)0x0;
LAB_0010a9ff:
          cVar20 = local_1ad0;
          if (piVar13 != (int *)0x0) goto LAB_0010ad3e;
        }
        else {
          clock_gettime(6,&local_1958);
          uVar9 = getpid();
          local_18a0._0_4_ = uVar9 ^ (uint)local_1958.tv_sec ^ (uint)local_1958.tv_nsec;
          local_18a0._4_4_ = CALL;
          local_18a0._8_4_ = 2;
          local_16c4._0_4_ = 100000;
          local_16c4._4_4_ = 3;
          local_16bc = 5;
          local_1978[0] = local_438;
          local_1968 = resultsp;
          local_1a10.prog = prog;
          local_1a10.vers = vers;
          local_1a10.proc = proc;
          local_1a10.args.args_val = (char *)argsp;
          local_19f0 = xargs;
          local_1960 = xresults;
          memcpy(local_16b8,&pAVar12->ah_cred,0x198);
          memcpy(local_1520,&pAVar12->ah_verf,0x198);
          xdrmem_ncreate(&local_19e8,(char *)addr,uVar11,XDR_ENCODE);
          _Var6 = xdr_ncallmsg(&local_19e8,(rpc_msg *)local_18a0);
          cVar20 = RPC_CANTENCODEARGS;
          if ((_Var6) && (_Var6 = xdr_rpcb_rmtcallargs(&local_19e8,&local_1a10), _Var6)) {
            uVar8 = (*(local_19e8.x_ops)->x_getpostn)(&local_19e8);
            if ((local_19e8.x_ops)->x_destroy != (_func_void_rpc_xdr_ptr *)0x0) {
              (*(local_19e8.x_ops)->x_destroy)(&local_19e8);
            }
            if (bVar5) {
              addr_00 = (int *)(*__ntirpc_pkg_params.malloc_)
                                         ((ulong)local_1acc,
                                          "/workspace/llm4binary/github/license_c_cmakelists/linuxbox2[P]ntirpc/src/clnt_bcast.c"
                                          ,0x189,"rpc_broadcast_exp");
              if (addr_00 == (int *)0x0) {
                cVar20 = RPC_SYSTEMERROR;
                addr_00 = (int *)0x0;
              }
              else {
                local_18a0._0_4_ = local_18a0._0_4_ + 1;
                local_16c4._0_4_ = 100000;
                local_16c4._4_4_ = 2;
                local_16bc = 5;
                local_1a48.xdr_args = (xdrproc_t)resultsp;
                local_1a48.prog = (u_long)xargs;
                local_1a48.vers = (u_long)argsp;
                local_1a48.proc._4_4_ = prog;
                local_1a48.arglen._0_4_ = vers;
                local_1a48.arglen._4_4_ = proc;
                local_1a48.args_ptr = (caddr_t)xresults;
                xdrmem_ncreate(&local_19e8,(char *)addr_00,local_1acc,XDR_ENCODE);
                _Var6 = xdr_ncallmsg(&local_19e8,(rpc_msg *)local_18a0);
                if ((_Var6) &&
                   (bVar10 = xdr_rmtcall_args((XDR *)&local_19e8,&local_1a48), (char)bVar10 != '\0')
                   ) {
                  uVar11 = (*(local_19e8.x_ops)->x_getpostn)(&local_19e8);
                  if ((local_19e8.x_ops)->x_destroy != (_func_void_rpc_xdr_ptr *)0x0) {
                    (*(local_19e8.x_ops)->x_destroy)(&local_19e8);
                  }
                  goto LAB_0010ae23;
                }
              }
            }
            else {
              addr_00 = (int *)0x0;
              uVar11 = 0;
LAB_0010ae23:
              cVar20 = local_1ad0;
              if (inittime <= waittime) {
                do {
                  nVar18 = 0;
                  do {
                    cVar20 = RPC_CANTSEND;
                    if (uVar8 <= *(uint *)(asStack_11d8[nVar18 * 0xb + -1].sa_data + 10)) {
                      piVar15 = &local_11f8 + nVar18 * 0x2c;
                      for (lVar24 = (long)((broadlist_t *)local_1148)[nVar18 * 0xb + -1].tqh_first;
                          cVar20 = local_1ad0, lVar24 != 0; lVar24 = *(long *)(lVar24 + 0x88)) {
                        local_1a60 = CONCAT44(local_1a60._4_4_,1);
                        setsockopt(*piVar15,1,6,&local_1a60,4);
                        if ((__rpc_lowvers == 0) &&
                           (uVar22 = sendto(*piVar15,addr,(ulong)uVar8,0,(sockaddr *)(lVar24 + 8),
                                            local_11e0[nVar18 * 0x2c]), uVar22 != uVar8)) {
                          pcVar21 = "clnt_bcast: cannot send broadcast packet";
joined_r0x0010af3d:
                          local_1ad0 = RPC_CANTSEND;
                          if ((__ntirpc_pkg_params.debug_flags._1_1_ & 0x10) != 0) {
                            (*__ntirpc_pkg_params.warnx_)(pcVar21);
                            local_1ad0 = RPC_CANTSEND;
                          }
                        }
                        else if ((bVar5) &&
                                ((*(int *)((long)&local_11f4 + nVar18 * 0xb0 + 4) == 0x11 &&
                                 (uVar22 = sendto(*piVar15,addr_00,(ulong)uVar11,0,
                                                  (sockaddr *)(lVar24 + 8),local_11e0[nVar18 * 0x2c]
                                                 ), uVar22 != uVar11)))) {
                          pcVar21 = "clnt_bcast: Cannot send broadcast packet";
                          goto joined_r0x0010af3d;
                        }
                      }
                    }
                    local_1ad0 = cVar20;
                    nVar18 = nVar18 + 1;
                  } while (nVar18 != __nfds);
                  if (eachresult == (resultproc_t)0x0) {
                    local_1ad0 = RPC_SUCCESS;
                    break;
                  }
LAB_0010af8f:
                  do {
                    iVar7 = poll(local_1948,__nfds,local_1a90);
                  } while (iVar7 == -1);
                  if (iVar7 == 0) {
                    local_1ad0 = RPC_TIMEDOUT;
                  }
                  else if (0 < iVar7) {
                    uVar22 = 0;
                    iVar17 = 0;
                    do {
                      if (local_1948[uVar22].revents != 0) {
                        if ((local_1948[uVar22].revents & 0x20U) == 0) {
                          iVar17 = iVar17 + 1;
                          do {
                            uVar14 = recvfrom((&local_11f8)[uVar22 * 0x2c],piVar13,
                                              (ulong)*(uint *)(asStack_11d8[uVar22 * 0xb + -1].
                                                               sa_data + 10),0,
                                              asStack_11d8 + uVar22 * 0xb,local_11e0 + uVar22 * 0x2c
                                             );
                            if (-1 < (int)(u_int)uVar14) {
                              if ((uVar14 & 0x7ffffffc) == 0) goto LAB_0010b0ab;
                              iVar1 = *piVar13;
                              iVar2 = *addr;
                              if (iVar1 == iVar2) {
                                ppcVar19 = local_1978;
                                pcVar23 = xdr_rpcb_rmtcallres;
                              }
                              else {
                                if ((!bVar5) || (iVar1 != *addr_00)) goto LAB_0010b0ab;
                                ppcVar19 = &local_1a48.args_ptr;
                                pcVar23 = xdr_rmtcallres;
                              }
                              memcpy(local_1870,&_null_auth,0x198);
                              local_18a0._32_8_ = pcVar23;
                              local_18a0._40_8_ = ppcVar19;
                              xdrmem_ncreate(&local_19e8,(char *)piVar13,(u_int)uVar14,XDR_DECODE);
                              _Var6 = xdr_nreplymsg(&local_19e8,(rpc_msg *)local_18a0);
                              if ((_Var6) &&
                                 (local_18a0._24_4_ == SUCCESS && local_18a0._16_4_ == MSG_ACCEPTED)
                                 ) {
                                if ((bVar5) && (iVar1 != iVar2)) {
                                  *(ushort *)asStack_11d8[uVar22 * 0xb].sa_data =
                                       local_1a14 << 8 | local_1a14 >> 8;
                                  local_1a60 = 0x8000000080;
                                  local_1a58 = asStack_11d8 + uVar22 * 0xb;
                                  _Var6 = (*eachresult)(resultsp,&local_1a60,
                                                        (&local_11e8)[uVar22 * 0x16]);
                                }
                                else {
                                  pnVar16 = uaddr2taddr((netconfig *)(&local_11e8)[uVar22 * 0x16],
                                                        local_438);
                                  _Var6 = (*eachresult)(resultsp,pnVar16,
                                                        (&local_11e8)[uVar22 * 0x16]);
                                  (*__ntirpc_pkg_params.free_size_)(pnVar16,0);
                                }
                              }
                              else {
                                _Var6 = false;
                              }
                              local_19e8.x_op = XDR_FREE;
                              local_18a0._32_8_ = xdr_void;
                              xdr_nreplymsg(&local_19e8,(rpc_msg *)local_18a0);
                              (*xresults)(&local_19e8,resultsp);
                              if ((local_19e8.x_ops)->x_destroy != (_func_void_rpc_xdr_ptr *)0x0) {
                                (*(local_19e8.x_ops)->x_destroy)(&local_19e8);
                              }
                              cVar20 = RPC_SUCCESS;
                              if (_Var6 != false) goto LAB_0010ad3e;
                              goto LAB_0010af8f;
                            }
                            piVar15 = __errno_location();
                          } while (*piVar15 == 4);
                          local_1ad0 = RPC_CANTRECV;
                          if ((__ntirpc_pkg_params.debug_flags._1_1_ & 0x10) != 0) {
                            (*__ntirpc_pkg_params.warnx_)
                                      ("clnt_bcast: Cannot receive reply to broadcast");
                          }
                        }
                        else {
                          local_1948[uVar22].fd = -1;
                          iVar17 = iVar17 + 1;
                        }
                      }
LAB_0010b0ab:
                      uVar22 = uVar22 + 1;
                    } while ((uVar22 < __nfds) && (iVar17 < iVar7));
                  }
                  local_1a90 = local_1a90 * 2;
                } while (local_1a90 <= waittime);
                goto LAB_0010a9ff;
              }
            }
          }
          else {
            addr_00 = (int *)0x0;
          }
LAB_0010ad3e:
          (*__ntirpc_pkg_params.free_size_)(piVar13,uVar25);
          local_1ad0 = cVar20;
        }
        if (addr != (int *)0x0) {
          (*__ntirpc_pkg_params.free_size_)(addr,uVar25);
        }
        vhandle = local_1a50;
        if (addr_00 != (int *)0x0) {
          (*__ntirpc_pkg_params.free_size_)(addr_00,(ulong)local_1acc);
        }
      }
      nVar18 = 0;
      do {
        close((&local_11f8)[nVar18 * 0x2c]);
        pvVar4 = ((broadlist_t *)local_1148)[nVar18 * 0xb + -1].tqh_first;
        while (pvVar4 != (void *)0x0) {
          pvVar3 = *(void **)((long)pvVar4 + 0x88);
          (*__ntirpc_pkg_params.free_size_)(pvVar4,0x98);
          pvVar4 = pvVar3;
        }
        nVar18 = nVar18 + 1;
      } while (nVar18 != __nfds);
      goto LAB_0010adc2;
    }
    if (local_1ad0 != RPC_SUCCESS) goto LAB_0010adc2;
  }
  local_1ad0 = RPC_UNKNOWNPROTO;
LAB_0010adc2:
  LOCK();
  piVar13 = &pAVar12->ah_refcnt;
  iVar7 = *piVar13;
  *piVar13 = *piVar13 + -1;
  UNLOCK();
  if (iVar7 - 1U == 0) {
    (*pAVar12->ah_ops->ah_destroy)(pAVar12);
  }
  if (((byte)__ntirpc_pkg_params.debug_flags & 0x80) != 0) {
    (*__ntirpc_pkg_params.warnx_)
              ("%s: auth_put(), refs %d\n","rpc_broadcast_exp",(ulong)(iVar7 - 1U));
  }
  __rpc_endconf(vhandle);
  return local_1ad0;
}

Assistant:

enum clnt_stat
rpc_broadcast_exp(rpcprog_t prog,	/* program number */
		  rpcvers_t vers,	/* version number */
		  rpcproc_t proc,	/* procedure number */
		  xdrproc_t xargs,	/* xdr routine for args */
		  void *argsp,	/* pointer to args */
		  xdrproc_t xresults,	/* xdr routine for results */
		  void *resultsp,	/* pointer to results */
		  resultproc_t eachresult, /* call with each result obtained */
		  int inittime,	/* how long to wait initially */
		  int waittime,	/* maximum time to wait */
		  const char *nettype /* transport type */)
{
	XDR xdrs[1];
	struct rpc_msg msg;	/* RPC message */
	struct timespec ts;
	char *outbuf = NULL;	/* Broadcast msg buffer */
	char *inbuf = NULL;	/* Reply buf */
	AUTH *sys_auth = authunix_ncreate_default();
	void *handle;
	struct netconfig *nconf;
	char uaddress[1024];	/* A self imposed limit */
	char *uaddrp = uaddress;
	int pmap_reply_flag;	/* reply recvd from PORTMAP */
	/* An array of all the suitable broadcast transports */
	struct {
		int fd;		/* File descriptor */
		int af;
		int proto;
		struct netconfig *nconf;	/* Netconfig structure */
		u_int asize;	/* Size of the addr buf */
		u_int dsize;	/* Size of the data buf */
		struct sockaddr_storage raddr;	/* Remote address */
		broadlist_t nal;
	} fdlist[MAXBCAST];
	struct pollfd pfd[MAXBCAST];
	size_t fdlistno = 0;
	struct r_rpcb_rmtcallargs barg;	/* Remote arguments */
	struct r_rpcb_rmtcallres bres;	/* Remote results */
	size_t outlen;
	int msec;
	int pollretval;
	int fds_found;
	int inlen;
	int i;
#ifdef PORTMAP
	size_t outlen_pmap = 0;
	int pmap_flag = 0;	/* UDP exists ? */
	char *outbuf_pmap = NULL;
	struct rmtcallargs barg_pmap;	/* Remote arguments */
	struct rmtcallres bres_pmap;	/* Remote results */
	u_int udpbufsz = 0;
#endif				/* PORTMAP */
	u_int maxbufsize = 0;
	enum clnt_stat stat = RPC_SUCCESS;	/* Return status */

	stat = sys_auth->ah_error.re_status;
	if (stat) {
		AUTH_DESTROY(sys_auth);
		return (stat);
	}

	/*
	 * initialization: create a fd, a broadcast address, and send the
	 * request on the broadcast transport.
	 * Listen on all of them and on replies, call the user supplied
	 * function.
	 */

	if (nettype == NULL)
		nettype = "datagram_n";
	handle = __rpc_setconf(nettype);
	if (handle == NULL) {
		stat = RPC_UNKNOWNPROTO;
		goto cleanup;
	}
	while ((nconf = __rpc_getconf(handle)) != NULL) {
		int fd;
		struct __rpc_sockinfo si;

		if (nconf->nc_semantics != NC_TPI_CLTS)
			continue;
		if (fdlistno >= MAXBCAST)
			break;	/* No more slots available */
		if (!__rpc_nconf2sockinfo(nconf, &si))
			continue;

		TAILQ_INIT(&fdlist[fdlistno].nal);
		if (__rpc_getbroadifs
		    (si.si_af, si.si_proto, si.si_socktype,
		     &fdlist[fdlistno].nal) == 0)
			continue;

		fd = socket(si.si_af, si.si_socktype, si.si_proto);
		if (fd < 0) {
			stat = RPC_CANTSEND;
			continue;
		}
		fdlist[fdlistno].af = si.si_af;
		fdlist[fdlistno].proto = si.si_proto;
		fdlist[fdlistno].fd = fd;
		fdlist[fdlistno].nconf = nconf;
		fdlist[fdlistno].asize = __rpc_get_a_size(si.si_af);
		pfd[fdlistno].events =
		    POLLIN | POLLPRI | POLLRDNORM | POLLRDBAND;
		pfd[fdlistno].fd = fdlist[fdlistno].fd = fd;
		fdlist[fdlistno].dsize =
		    __rpc_get_t_size(si.si_af, si.si_proto, 0);

		if (maxbufsize <= fdlist[fdlistno].dsize)
			maxbufsize = fdlist[fdlistno].dsize;

#ifdef PORTMAP
		if (si.si_af == AF_INET && si.si_proto == IPPROTO_UDP) {
			if (udpbufsz < fdlist[fdlistno].dsize)
				udpbufsz = fdlist[fdlistno].dsize;
			pmap_flag = 1;
		}
#endif				/* PORTMAP */
		fdlistno++;
	}

	if (fdlistno == 0) {
		if (stat == RPC_SUCCESS)
			stat = RPC_UNKNOWNPROTO;
		goto done_broad;
	}
	if (maxbufsize == 0) {
		if (stat == RPC_SUCCESS)
			stat = RPC_CANTSEND;
		goto done_broad;
	}
	inbuf = mem_alloc(maxbufsize);
	outbuf = mem_alloc(maxbufsize);
	if ((inbuf == NULL) || (outbuf == NULL)) {
		stat = RPC_SYSTEMERROR;
		goto done_broad;
	}

	/* Serialize all the arguments which have to be sent */
	(void)clock_gettime(CLOCK_MONOTONIC_FAST, &ts);
	msg.rm_xid = __RPC_GETXID(&ts);
	msg.rm_direction = CALL;
	msg.rm_call.cb_rpcvers = RPC_MSG_VERSION;
	msg.cb_prog = RPCBPROG;
	msg.cb_vers = RPCBVERS;
	msg.cb_proc = RPCBPROC_CALLIT;
	barg.prog = prog;
	barg.vers = vers;
	barg.proc = proc;
	barg.args.args_val = argsp;
	barg.xdr_args = xargs;
	bres.addr = uaddrp;
	bres.results.results_val = resultsp;
	bres.xdr_res = xresults;
	msg.cb_cred = sys_auth->ah_cred;
	msg.cb_verf = sys_auth->ah_verf;
	xdrmem_create(xdrs, outbuf, maxbufsize, XDR_ENCODE);
	if ((!xdr_callmsg(xdrs, &msg))
	    ||
	    (!xdr_rpcb_rmtcallargs
	     (xdrs, (struct rpcb_rmtcallargs *)(void *)&barg))) {
		stat = RPC_CANTENCODEARGS;
		goto done_broad;
	}
	outlen = xdr_getpos(xdrs);
	xdr_destroy(xdrs);

#ifdef PORTMAP
	/* Prepare the packet for version 2 PORTMAP */
	if (pmap_flag) {
		outbuf_pmap = mem_alloc(udpbufsz);
		if (outbuf_pmap == NULL) {
			stat = RPC_SYSTEMERROR;
			goto done_broad;
		}
		msg.rm_xid++;	/* One way to distinguish */
		msg.cb_prog = PMAPPROG;
		msg.cb_vers = PMAPVERS;
		msg.cb_proc = PMAPPROC_CALLIT;
		barg_pmap.prog = prog;
		barg_pmap.vers = vers;
		barg_pmap.proc = proc;
		barg_pmap.args_ptr = argsp;
		barg_pmap.xdr_args = xargs;
		bres_pmap.xdr_results = xresults;
		bres_pmap.results_ptr = resultsp;
		xdrmem_create(xdrs, outbuf_pmap, udpbufsz, XDR_ENCODE);
		if ((!xdr_callmsg(xdrs, &msg))
		    || (!xdr_rmtcall_args(xdrs, &barg_pmap))) {
			stat = RPC_CANTENCODEARGS;
			goto done_broad;
		}
		outlen_pmap = xdr_getpos(xdrs);
		xdr_destroy(xdrs);
	}
#endif				/* PORTMAP */

	/*
	 * Basic loop: broadcast the packets to transports which
	 * support data packets of size such that one can encode
	 * all the arguments.
	 * Wait a while for response(s).
	 * The response timeout grows larger per iteration.
	 */
	for (msec = inittime; msec <= waittime; msec += msec) {
		struct broadif *bip;

		/* Broadcast all the packets now */
		for (i = 0; i < fdlistno; i++) {
			if (fdlist[i].dsize < outlen) {
				stat = RPC_CANTSEND;
				continue;
			}
			for (bip = TAILQ_FIRST(&fdlist[i].nal); bip != NULL;
			     bip = TAILQ_NEXT(bip, link)) {
				void *addr;

				addr = &bip->broadaddr;

				__rpc_broadenable(fdlist[i].af, fdlist[i].fd,
						  bip);

				/*
				 * Only use version 3 if lowvers is not set
				 */

				if (!__rpc_lowvers)
					if (sendto
					    (fdlist[i].fd, outbuf, outlen, 0,
					     (struct sockaddr *)addr,
					     (size_t) fdlist[i].asize) !=
					    outlen) {
#ifdef RPC_DEBUG
						perror("sendto");
#endif
						__warnx
						   (TIRPC_DEBUG_FLAG_CLNT_BCAST,
						    "clnt_bcast: cannot send "
						    "broadcast packet");
						stat = RPC_CANTSEND;
						continue;
					};
#ifdef RPC_DEBUG
				if (!__rpc_lowvers)
					fprintf(stderr,
						"Broadcast packet sent "
						"for %s\n",
						fdlist[i].nconf->nc_netid);
#endif
#ifdef PORTMAP
				/*
				 * Send the version 2 packet also
				 * for UDP/IP
				 */
				if (pmap_flag && fdlist[i].proto
				    == IPPROTO_UDP) {
					if (sendto
					    (fdlist[i].fd, outbuf_pmap,
					     outlen_pmap, 0, addr,
					     (size_t) fdlist[i].asize) !=
					    outlen_pmap) {
						__warnx
						   (TIRPC_DEBUG_FLAG_CLNT_BCAST,
						    "clnt_bcast: Cannot send "
						    "broadcast packet");
						stat = RPC_CANTSEND;
						continue;
					}
				}
#ifdef RPC_DEBUG
				fprintf(stderr,
					"PMAP Broadcast packet "
					"sent for %s\n",
					fdlist[i].nconf->nc_netid);
#endif
#endif				/* PORTMAP */
			}
			/* End for sending all packets on this transport */
		}		/* End for sending on all transports */

		if (eachresult == NULL) {
			stat = RPC_SUCCESS;
			goto done_broad;
		}

		/*
		 * Get all the replies from these broadcast requests
		 */
 recv_again:

		switch (pollretval = poll(pfd, fdlistno, msec)) {
		case 0:	/* timed out */
			stat = RPC_TIMEDOUT;
			continue;
		case -1:	/* some kind of error - we ignore it */
			goto recv_again;
		}		/* end of poll results switch */

		for (i = fds_found = 0; i < fdlistno && fds_found < pollretval;
		     i++) {
			bool done = false;

			if (pfd[i].revents == 0)
				continue;
			else if (pfd[i].revents & POLLNVAL) {
				/*
				 * Something bad has happened to this descri-
				 * ptor. We can cause _poll() to ignore
				 * it simply by using a negative fd.  We do that
				 * rather than compacting the pfd[] and fdlist[]
				 * arrays.
				 */
				pfd[i].fd = -1;
				fds_found++;
				continue;
			} else
				fds_found++;
#ifdef RPC_DEBUG
			fprintf(stderr, "response for %s\n",
				fdlist[i].nconf->nc_netid);
#endif
 try_again:
			inlen =
			    recvfrom(fdlist[i].fd, inbuf, fdlist[i].dsize, 0,
				     (struct sockaddr *)(void *)
				     &fdlist[i].raddr, &fdlist[i].asize);
			if (inlen < 0) {
				if (errno == EINTR)
					goto try_again;
				__warnx(TIRPC_DEBUG_FLAG_CLNT_BCAST,
					"clnt_bcast: Cannot receive reply to broadcast");
				stat = RPC_CANTRECV;
				continue;
			}
			if (inlen < sizeof(u_int32_t))
				continue;	/* Drop that and go ahead */
			/*
			 * see if reply transaction id matches sent id.
			 * If so, decode the results. If return id is xid + 1
			 * it was a PORTMAP reply
			 */
			if (*((u_int32_t *) (void *)(inbuf)) ==
			    *((u_int32_t *) (void *)(outbuf))) {
				pmap_reply_flag = 0;
				msg.RPCM_ack.ar_verf = _null_auth;
				msg.RPCM_ack.ar_results.where =
				    &bres;
				msg.RPCM_ack.ar_results.proc =
				    (xdrproc_t) xdr_rpcb_rmtcallres;
#ifdef PORTMAP
			} else if (pmap_flag
				   && *((u_int32_t *) (void *)(inbuf)) ==
				   *((u_int32_t *) (void *)(outbuf_pmap))) {
				pmap_reply_flag = 1;
				msg.RPCM_ack.ar_verf = _null_auth;
				msg.RPCM_ack.ar_results.where =
				    &bres_pmap;
				msg.RPCM_ack.ar_results.proc =
				    (xdrproc_t) xdr_rmtcallres;
#endif				/* PORTMAP */
			} else
				continue;
			xdrmem_create(xdrs, inbuf, (u_int) inlen, XDR_DECODE);
			if (xdr_replymsg(xdrs, &msg)) {
				if ((msg.rm_reply.rp_stat == MSG_ACCEPTED)
				    && (msg.RPCM_ack.ar_stat == SUCCESS)) {
					struct netbuf *np;
#ifdef PORTMAP
					struct netbuf taddr;
					struct sockaddr_in sin;

					if (pmap_flag && pmap_reply_flag) {
						memcpy(&sin, &fdlist[i].raddr,
						       sizeof(sin));
						sin.sin_port =
						    htons(bres_pmap.port);
						memcpy(&fdlist[i].raddr, &sin,
						       sizeof(sin));
						taddr.len = taddr.maxlen =
						    sizeof(fdlist[i].raddr);
						taddr.buf = &fdlist[i].raddr;
						done =
						    (*eachresult) (resultsp,
								   &taddr,
								   fdlist[i].
								   nconf);
					} else {
#endif				/* PORTMAP */
#ifdef RPC_DEBUG
						fprintf(stderr, "uaddr %s\n",
							uaddrp);
#endif
						np = uaddr2taddr(fdlist[i].
								 nconf, uaddrp);
						done =
						    (*eachresult) (resultsp, np,
								   fdlist[i].
								   nconf);
						mem_free(np, 0);
#ifdef PORTMAP
					}
#endif				/* PORTMAP */
				}
				/* otherwise, we just ignore the errors ... */
			}
			/* else some kind of deserialization problem ... */

			xdrs->x_op = XDR_FREE;
			msg.RPCM_ack.ar_results.proc = (xdrproc_t) xdr_void;
			(void)xdr_replymsg(xdrs, &msg);
			(void)(*xresults) (xdrs, resultsp);
			XDR_DESTROY(xdrs);
			if (done) {
				stat = RPC_SUCCESS;
				goto done_broad;
			} else {
				goto recv_again;
			}
		}		/* The recv for loop */
	}			/* The giant for loop */

 done_broad:
	if (inbuf)
		mem_free(inbuf, maxbufsize);
	if (outbuf)
		mem_free(outbuf, maxbufsize);
#ifdef PORTMAP
	if (outbuf_pmap)
		mem_free(outbuf_pmap, udpbufsz);
#endif				/* PORTMAP */
	for (i = 0; i < fdlistno; i++) {
		(void)close(fdlist[i].fd);
		__rpc_freebroadifs(&fdlist[i].nal);
	}
 cleanup:
	AUTH_DESTROY(sys_auth);
	(void)__rpc_endconf(handle);

	return (stat);
}